

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O0

size_t __thiscall
absl::lts_20250127::log_internal::anon_unknown_3::FormatBoundedFields
          (anon_unknown_3 *this,LogSeverity severity,Time timestamp,Tid tid,Span<char> *buf)

{
  Duration d;
  Time t;
  uint32_t uVar1;
  size_type sVar2;
  pointer pcVar3;
  char *pcVar4;
  int64_t iVar5;
  Nonnull<char_*> pcVar6;
  size_t sVar7;
  uint32_t tid_00;
  uint uVar8;
  undefined8 extraout_RDX;
  uint32_t in_register_00000034;
  HiRep this_00;
  undefined4 in_register_00000084;
  Span<char> *this_01;
  Time t_00;
  size_t bytes_formatted;
  int64_t usecs;
  undefined1 local_d8 [8];
  CivilInfo ci;
  char *p;
  int local_98;
  int local_94;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)131067,_(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)655355>
  local_90;
  int local_80;
  HiRep HStack_7c;
  int snprintf_result;
  uint local_74;
  HiRep local_6c;
  uint local_64;
  undefined1 local_60 [8];
  timeval tv;
  TimeZone *tz;
  size_t kBoundedFieldsMaxLen;
  Span<char> *buf_local;
  Tid tid_local;
  LogSeverity severity_local;
  Time timestamp_local;
  
  this_01 = (Span<char> *)CONCAT44(in_register_00000084,tid);
  this_00.hi_ = in_register_00000034;
  this_00.lo_ = severity;
  tid_00 = timestamp.rep_.rep_lo_;
  uVar8 = timestamp.rep_.rep_hi_.lo_;
  sVar2 = Span<char>::size(this_01);
  if (sVar2 < 0x22) {
    sVar2 = Span<char>::size(this_01);
    Span<char>::remove_suffix(this_01,sVar2);
    timestamp_local.rep_.rep_hi_.hi_ = 0;
    timestamp_local.rep_.rep_lo_ = 0;
  }
  else {
    tv.tv_usec = (__suseconds_t)TimeZone();
    if ((TimeZone *)tv.tv_usec == (TimeZone *)0x0) {
      t_00.rep_.rep_hi_.hi_ = 0;
      t_00.rep_.rep_hi_.lo_ = uVar8;
      t_00.rep_.rep_lo_ = (uint32_t)extraout_RDX;
      HStack_7c = this_00;
      local_74 = uVar8;
      local_6c = this_00;
      local_64 = uVar8;
      _local_60 = ToTimeval((lts_20250127 *)this_00,t_00);
      pcVar3 = Span<char>::data(this_01);
      sVar2 = Span<char>::size(this_01);
      str_format_internal::
      FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)131067,_(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)655355>
      ::FormatSpecTemplate(&local_90,"%c0000 00:00:%02d.%06d %7d ");
      pcVar4 = LogSeverityName((LogSeverity)this);
      local_94 = local_60._0_4_;
      local_98 = local_60._8_4_;
      p._4_4_ = tid_00;
      local_80 = SNPrintF<char,_int,_int,_int>
                           (pcVar3,sVar2,&local_90,pcVar4,&local_94,&local_98,(int *)((long)&p + 4))
      ;
      if (local_80 < 0) {
        timestamp_local.rep_.rep_hi_.hi_ = 0;
        timestamp_local.rep_.rep_lo_ = 0;
      }
      else {
        Span<char>::remove_prefix(this_01,(long)local_80);
        timestamp_local.rep_._4_8_ = SEXT48(local_80);
      }
    }
    else {
      ci.zone_abbr = Span<char>::data(this_01);
      pcVar4 = LogSeverityName((LogSeverity)this);
      *ci.zone_abbr = *pcVar4;
      t.rep_.rep_lo_ = uVar8;
      t.rep_.rep_hi_ = this_00;
      ci.zone_abbr = ci.zone_abbr + 1;
      lts_20250127::TimeZone::At((CivilInfo *)local_d8,(TimeZone *)tv.tv_usec,t);
      uVar1 = time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::second_tag>
              ::month((civil_time<absl::lts_20250127::time_internal::second_tag> *)local_d8);
      numbers_internal::PutTwoDigits(uVar1,ci.zone_abbr);
      ci.zone_abbr = ci.zone_abbr + 2;
      uVar1 = time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::second_tag>
              ::day((civil_time<absl::lts_20250127::time_internal::second_tag> *)local_d8);
      numbers_internal::PutTwoDigits(uVar1,ci.zone_abbr);
      pcVar4 = ci.zone_abbr + 2;
      ci.zone_abbr = ci.zone_abbr + 3;
      *pcVar4 = ' ';
      uVar1 = time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::second_tag>
              ::hour((civil_time<absl::lts_20250127::time_internal::second_tag> *)local_d8);
      numbers_internal::PutTwoDigits(uVar1,ci.zone_abbr);
      pcVar4 = ci.zone_abbr + 2;
      ci.zone_abbr = ci.zone_abbr + 3;
      *pcVar4 = ':';
      uVar1 = time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::second_tag>
              ::minute((civil_time<absl::lts_20250127::time_internal::second_tag> *)local_d8);
      numbers_internal::PutTwoDigits(uVar1,ci.zone_abbr);
      pcVar4 = ci.zone_abbr + 2;
      ci.zone_abbr = ci.zone_abbr + 3;
      *pcVar4 = ':';
      uVar1 = time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::second_tag>
              ::second((civil_time<absl::lts_20250127::time_internal::second_tag> *)local_d8);
      numbers_internal::PutTwoDigits(uVar1,ci.zone_abbr);
      pcVar4 = ci.zone_abbr + 2;
      ci.zone_abbr = ci.zone_abbr + 3;
      *pcVar4 = '.';
      d.rep_lo_ = ci.subsecond.rep_hi_.lo_;
      d.rep_hi_ = (HiRep)ci.cs.f_._8_8_;
      iVar5 = ToInt64Microseconds(d);
      numbers_internal::PutTwoDigits((uint32_t)(iVar5 / 10000),ci.zone_abbr);
      ci.zone_abbr = ci.zone_abbr + 2;
      numbers_internal::PutTwoDigits((uint32_t)((iVar5 / 100) % 100),ci.zone_abbr);
      ci.zone_abbr = ci.zone_abbr + 2;
      numbers_internal::PutTwoDigits((uint32_t)(iVar5 % 100),ci.zone_abbr);
      pcVar4 = ci.zone_abbr + 2;
      ci.zone_abbr = ci.zone_abbr + 3;
      *pcVar4 = ' ';
      PutLeadingWhitespace<int>(tid_00,&ci.zone_abbr);
      pcVar6 = numbers_internal::FastIntToBuffer(tid_00,ci.zone_abbr);
      *pcVar6 = ' ';
      ci.zone_abbr = pcVar6 + 1;
      pcVar3 = Span<char>::data(this_01);
      timestamp_local.rep_._4_8_ = (long)(pcVar6 + 1) - (long)pcVar3;
      Span<char>::remove_prefix(this_01,timestamp_local.rep_._4_8_);
    }
  }
  sVar7._0_4_ = timestamp_local.rep_.rep_hi_.hi_;
  sVar7._4_4_ = timestamp_local.rep_.rep_lo_;
  return sVar7;
}

Assistant:

size_t FormatBoundedFields(absl::LogSeverity severity, absl::Time timestamp,
                           log_internal::Tid tid, absl::Span<char>& buf) {
  constexpr size_t kBoundedFieldsMaxLen =
      sizeof("SMMDD HH:MM:SS.NNNNNN  ") +
      (1 + std::numeric_limits<log_internal::Tid>::digits10 + 1) - sizeof("");
  if (ABSL_PREDICT_FALSE(buf.size() < kBoundedFieldsMaxLen)) {
    // We don't bother trying to truncate these fields if the buffer is too
    // short (or almost too short) because it would require doing a lot more
    // length checking (slow) and it should never happen.  A 15kB buffer should
    // be enough for anyone.  Instead we mark `buf` full without writing
    // anything.
    buf.remove_suffix(buf.size());
    return 0;
  }

  // We can't call absl::LocalTime(), localtime_r(), or anything else here that
  // isn't async-signal-safe. We can only use the time zone if it has already
  // been loaded.
  const absl::TimeZone* tz = absl::log_internal::TimeZone();
  if (ABSL_PREDICT_FALSE(tz == nullptr)) {
    // If a time zone hasn't been set yet because we are logging before the
    // logging library has been initialized, we fallback to a simpler, slower
    // method. Just report the raw Unix time in seconds. We cram this into the
    // normal time format for the benefit of parsers.
    auto tv = absl::ToTimeval(timestamp);
    int snprintf_result = absl::SNPrintF(
        buf.data(), buf.size(), "%c0000 00:00:%02d.%06d %7d ",
        absl::LogSeverityName(severity)[0], static_cast<int>(tv.tv_sec),
        static_cast<int>(tv.tv_usec), static_cast<int>(tid));
    if (snprintf_result >= 0) {
      buf.remove_prefix(static_cast<size_t>(snprintf_result));
      return static_cast<size_t>(snprintf_result);
    }
    return 0;
  }

  char* p = buf.data();
  *p++ = absl::LogSeverityName(severity)[0];
  const absl::TimeZone::CivilInfo ci = tz->At(timestamp);
  absl::numbers_internal::PutTwoDigits(static_cast<uint32_t>(ci.cs.month()), p);
  p += 2;
  absl::numbers_internal::PutTwoDigits(static_cast<uint32_t>(ci.cs.day()), p);
  p += 2;
  *p++ = ' ';
  absl::numbers_internal::PutTwoDigits(static_cast<uint32_t>(ci.cs.hour()), p);
  p += 2;
  *p++ = ':';
  absl::numbers_internal::PutTwoDigits(static_cast<uint32_t>(ci.cs.minute()),
                                       p);
  p += 2;
  *p++ = ':';
  absl::numbers_internal::PutTwoDigits(static_cast<uint32_t>(ci.cs.second()),
                                       p);
  p += 2;
  *p++ = '.';
  const int64_t usecs = absl::ToInt64Microseconds(ci.subsecond);
  absl::numbers_internal::PutTwoDigits(static_cast<uint32_t>(usecs / 10000), p);
  p += 2;
  absl::numbers_internal::PutTwoDigits(static_cast<uint32_t>(usecs / 100 % 100),
                                       p);
  p += 2;
  absl::numbers_internal::PutTwoDigits(static_cast<uint32_t>(usecs % 100), p);
  p += 2;
  *p++ = ' ';
  PutLeadingWhitespace(tid, p);
  p = absl::numbers_internal::FastIntToBuffer(tid, p);
  *p++ = ' ';
  const size_t bytes_formatted = static_cast<size_t>(p - buf.data());
  buf.remove_prefix(bytes_formatted);
  return bytes_formatted;
}